

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::hasMods(HighsLp *this)

{
  size_type sVar1;
  long in_RDI;
  undefined1 local_9;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260));
  local_9 = true;
  if (sVar1 == 0) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x278));
    local_9 = true;
    if (sVar1 == 0) {
      sVar1 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d8));
      local_9 = true;
      if (sVar1 == 0) {
        sVar1 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x308));
        local_9 = true;
        if (sVar1 == 0) {
          sVar1 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x338));
          local_9 = sVar1 != 0;
        }
      }
    }
  }
  return local_9;
}

Assistant:

bool HighsLp::hasMods() const {
  return this->mods_.save_non_semi_variable_index.size() > 0 ||
         this->mods_.save_inconsistent_semi_variable_index.size() > 0 ||
         this->mods_.save_relaxed_semi_variable_lower_bound_index.size() > 0 ||
         this->mods_.save_tightened_semi_variable_upper_bound_index.size() >
             0 ||
         this->mods_.save_inf_cost_variable_index.size() > 0;
}